

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::UnpackSnorm4x8Case::UnpackSnorm4x8Case
          (UnpackSnorm4x8Case *this,TestContext *testCtx,ShaderType shaderType)

{
  char *pcVar1;
  VarType local_168;
  allocator<char> local_149;
  string local_148;
  Symbol local_128;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  Symbol local_b0;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ShaderType local_1c;
  TestContext *pTStack_18;
  ShaderType shaderType_local;
  TestContext *testCtx_local;
  UnpackSnorm4x8Case *this_local;
  
  local_1c = shaderType;
  pTStack_18 = testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"unpacksnorm4x8",&local_61)
  ;
  pcVar1 = shaderexecutor::anon_unknown_0::getShaderTypePostfix(local_1c);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,testCtx,pcVar1,"unpackSnorm4x8",local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__UnpackSnorm4x8Case_016b6f98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"in0",&local_d1);
  glu::VarType::VarType(&local_f0,TYPE_UINT,PRECISION_HIGHP);
  Symbol::Symbol(&local_b0,&local_d0,&local_f0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_b0);
  Symbol::~Symbol(&local_b0);
  glu::VarType::~VarType(&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"out0",&local_149);
  glu::VarType::VarType(&local_168,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  Symbol::Symbol(&local_128,&local_148,&local_168);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_128);
  Symbol::~Symbol(&local_128);
  glu::VarType::~VarType(&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPackingFunctionCase).m_spec.source,
             "out0 = unpackSnorm4x8(in0);");
  return;
}

Assistant:

UnpackSnorm4x8Case (tcu::TestContext& testCtx, glu::ShaderType shaderType)
		: ShaderPackingFunctionCase	(testCtx, (string("unpacksnorm4x8") + getShaderTypePostfix(shaderType)).c_str(), "unpackSnorm4x8", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = unpackSnorm4x8(in0);";
	}